

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_resize_nn(rf_image *__return_storage_ptr__,rf_image image,int new_width,int new_height,
                  rf_allocator allocator)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long *in_FS_OFFSET;
  undefined4 uStack_cc;
  undefined4 uStack_94;
  rf_image local_78;
  undefined8 local_60;
  long local_58;
  undefined4 local_50;
  char *local_48;
  char *local_40;
  undefined8 local_38;
  void *local_30;
  void *dst;
  int local_20;
  int dst_size;
  int new_height_local;
  int new_width_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  _new_height_local = allocator.user_data;
  local_20 = new_height;
  dst_size = new_width;
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) {
    rf_log_impl(8,0x1b291e,(char *)0x1);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_resize_nn";
    *(undefined8 *)(lVar1 + -0x450) = 0x3e78;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_cc,1);
  }
  else {
    iVar3 = dst_size * local_20;
    iVar2 = rf_bytes_per_pixel(image.format);
    dst._4_4_ = iVar3 * iVar2;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_40 = "rf_image_resize_nn";
    local_38 = 0x3e70;
    local_60 = 0;
    local_58 = (long)(int)dst._4_4_;
    local_50 = 0;
    local_30 = (void *)(*(code *)allocator_local.user_data)(&new_height_local,1);
    if (local_30 == (void *)0x0) {
      rf_log_impl(8,0x1b25a7,(char *)0x2,(ulong)dst._4_4_);
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_image_resize_nn";
      *(undefined8 *)(lVar1 + -0x450) = 0x3e76;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_94,2);
    }
    else {
      rf_image_resize_nn_to_buffer(&local_78,image,dst_size,local_20,local_30,(long)(int)dst._4_4_);
      __return_storage_ptr__->data = local_78.data;
      __return_storage_ptr__->width = local_78.width;
      __return_storage_ptr__->height = local_78.height;
      __return_storage_ptr__->format = local_78.format;
      __return_storage_ptr__->valid = local_78.valid;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_78._21_3_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_resize_nn(rf_image image, int new_width, int new_height, rf_allocator allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        int dst_size = new_width * new_height * rf_bytes_per_pixel(image.format);
        void* dst = RF_ALLOC(allocator, dst_size);

        if (dst)
        {
            result = rf_image_resize_nn_to_buffer(image, new_width, new_height, dst, dst_size);
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Allocation of size %d failed.", dst_size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}